

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O2

int __thiscall ON_Sphere::GetNurbForm(ON_Sphere *this,ON_NurbsSurface *s)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  ulong uVar14;
  ON_4dPoint *pOVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ON_3dPoint *local_1d0;
  ON_3dVector z;
  ON_4dPoint northpole;
  ON_4dPoint southpole;
  ON_3dPoint local_170;
  ON_3dPoint p [9];
  ON_3dPoint local_78;
  ON_3dVector y;
  ON_3dVector x;
  
  bVar12 = IsValid(this);
  iVar13 = 0;
  if (bVar12) {
    ON_NurbsSurface::Create(s,3,true,3,3,9,5);
    pdVar3 = s->m_knot[0];
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    pdVar3[2] = 1.5707963267948966;
    pdVar3[3] = 1.5707963267948966;
    pdVar3[4] = 3.141592653589793;
    pdVar3[5] = 3.141592653589793;
    pdVar3[6] = 4.71238898038469;
    pdVar3[7] = 4.71238898038469;
    pdVar3[8] = 6.283185307179586;
    pdVar3[9] = 6.283185307179586;
    pdVar3 = s->m_knot[1];
    *pdVar3 = -1.5707963267948966;
    pdVar3[1] = -1.5707963267948966;
    pdVar3[2] = 0.0;
    pdVar3[3] = 0.0;
    pdVar3[4] = 1.5707963267948966;
    pdVar3[5] = 1.5707963267948966;
    pdVar3 = s->m_cv;
    ::operator*(&x,this->radius,&(this->plane).xaxis);
    ::operator*(&y,this->radius,&(this->plane).yaxis);
    ::operator*(&z,this->radius,&(this->plane).zaxis);
    local_1d0 = p;
    ON_3dPoint::operator+(local_1d0,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator+((ON_3dPoint *)&southpole,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator+(p + 1,(ON_3dPoint *)&southpole,&y);
    ON_3dPoint::operator+(p + 2,(ON_3dPoint *)this,&y);
    ON_3dPoint::operator-((ON_3dPoint *)&northpole,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator+(p + 3,(ON_3dPoint *)&northpole,&y);
    ON_3dPoint::operator-(p + 4,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator-(&local_170,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator-(p + 5,&local_170,&y);
    ON_3dPoint::operator-(p + 6,(ON_3dPoint *)this,&y);
    ON_3dPoint::operator+(&local_78,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator-(p + 7,&local_78,&y);
    ON_3dPoint::operator+(p + 8,(ON_3dPoint *)this,&x);
    ON_3dPoint::operator-((ON_3dPoint *)&northpole,(ON_3dPoint *)this,&z);
    ON_4dPoint::ON_4dPoint(&southpole,(ON_3dPoint *)&northpole);
    ON_3dPoint::operator+(&local_170,(ON_3dPoint *)this,&z);
    ON_4dPoint::ON_4dPoint(&northpole,&local_170);
    lVar16 = 0;
    for (uVar14 = 0; uVar14 != 8; uVar14 = uVar14 + 1) {
      pOVar15 = (ON_4dPoint *)(lVar16 + 0x20 + (long)pdVar3);
      pOVar15[-1].z = southpole.z;
      pOVar15[-1].w = southpole.w;
      pOVar15[-1].x = southpole.x;
      pOVar15[-1].y = southpole.y;
      ON_3dPoint::operator-(&local_170,local_1d0,&z);
      ON_4dPoint::operator=(pOVar15,&local_170);
      ON_4dPoint::operator=((ON_4dPoint *)(lVar16 + 0x40 + (long)pdVar3),local_1d0);
      ON_3dPoint::operator+(&local_170,local_1d0,&z);
      pOVar15 = (ON_4dPoint *)(lVar16 + 0x60 + (long)pdVar3);
      ON_4dPoint::operator=(pOVar15,&local_170);
      pOVar15[1].z = northpole.z;
      pOVar15[1].w = northpole.w;
      pOVar15[1].x = northpole.x;
      pOVar15[1].y = northpole.y;
      uVar17 = 0x667f3bcc;
      uVar18 = 0x3fe6a09e;
      if ((uVar14 & 1) != 0) {
        pdVar1 = (double *)((long)pdVar3 + lVar16 + 0x40);
        dVar7 = pdVar1[1];
        pdVar2 = (double *)((long)pdVar3 + lVar16 + 0x80);
        dVar10 = pdVar2[1];
        dVar5 = ((double *)((long)pdVar3 + lVar16))[1] * 0.7071067811865475;
        auVar4._8_4_ = SUB84(dVar5,0);
        auVar4._0_8_ = *(double *)((long)pdVar3 + lVar16) * 0.7071067811865475;
        auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
        *(undefined1 (*) [16])((long)pdVar3 + lVar16) = auVar4;
        *(double *)((long)pdVar3 + lVar16 + 0x10) =
             *(double *)((long)pdVar3 + lVar16 + 0x10) * 0.7071067811865475;
        *(undefined8 *)((long)pdVar3 + lVar16 + 0x18) = 0x3fe6a09e667f3bcc;
        dVar7 = dVar7 * 0.7071067811865475;
        auVar6._8_4_ = SUB84(dVar7,0);
        auVar6._0_8_ = *pdVar1 * 0.7071067811865475;
        auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
        *(undefined1 (*) [16])((long)pdVar3 + lVar16 + 0x40) = auVar6;
        *(double *)((long)pdVar3 + lVar16 + 0x50) =
             *(double *)((long)pdVar3 + lVar16 + 0x50) * 0.7071067811865475;
        *(undefined8 *)((long)pdVar3 + lVar16 + 0x58) = 0x3fe6a09e667f3bcc;
        dVar10 = dVar10 * 0.7071067811865475;
        auVar8._8_4_ = SUB84(dVar10,0);
        auVar8._0_8_ = *pdVar2 * 0.7071067811865475;
        auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
        *(undefined1 (*) [16])((long)pdVar3 + lVar16 + 0x80) = auVar8;
        *(double *)((long)pdVar3 + lVar16 + 0x90) =
             *(double *)((long)pdVar3 + lVar16 + 0x90) * 0.7071067811865475;
        *(undefined8 *)((long)pdVar3 + lVar16 + 0x98) = 0x3fe6a09e667f3bcc;
        uVar17 = 0;
        uVar18 = 0x3fe00000;
      }
      pdVar1 = (double *)((long)pdVar3 + lVar16 + 0x20);
      pdVar2 = (double *)((long)pdVar3 + lVar16 + 0x60);
      dVar7 = pdVar2[1];
      dVar5 = pdVar1[1] * (double)CONCAT44(uVar18,uVar17);
      auVar9._8_4_ = SUB84(dVar5,0);
      auVar9._0_8_ = *pdVar1 * (double)CONCAT44(uVar18,uVar17);
      auVar9._12_4_ = (int)((ulong)dVar5 >> 0x20);
      *(undefined1 (*) [16])((long)pdVar3 + lVar16 + 0x20) = auVar9;
      *(double *)((long)pdVar3 + lVar16 + 0x30) =
           *(double *)((long)pdVar3 + lVar16 + 0x30) * (double)CONCAT44(uVar18,uVar17);
      *(ulong *)((long)pdVar3 + lVar16 + 0x38) = CONCAT44(uVar18,uVar17);
      dVar7 = dVar7 * (double)CONCAT44(uVar18,uVar17);
      auVar11._8_4_ = SUB84(dVar7,0);
      auVar11._0_8_ = *pdVar2 * (double)CONCAT44(uVar18,uVar17);
      auVar11._12_4_ = (int)((ulong)dVar7 >> 0x20);
      *(undefined1 (*) [16])((long)pdVar3 + lVar16 + 0x60) = auVar11;
      *(double *)((long)pdVar3 + lVar16 + 0x70) =
           *(double *)((long)pdVar3 + lVar16 + 0x70) * (double)CONCAT44(uVar18,uVar17);
      *(ulong *)((long)pdVar3 + lVar16 + 0x78) = CONCAT44(uVar18,uVar17);
      lVar16 = lVar16 + 0xa0;
      local_1d0 = local_1d0 + 1;
    }
    pdVar3[0xa2] = pdVar3[2];
    pdVar3[0xa3] = pdVar3[3];
    pdVar3[0xa0] = *pdVar3;
    pdVar3[0xa1] = pdVar3[1];
    pdVar3[0xa4] = pdVar3[4];
    pdVar3[0xa5] = pdVar3[5];
    pdVar3[0xa6] = pdVar3[6];
    pdVar3[0xa7] = pdVar3[7];
    pdVar3[0xa8] = pdVar3[8];
    pdVar3[0xa9] = pdVar3[9];
    pdVar3[0xaa] = pdVar3[10];
    pdVar3[0xab] = pdVar3[0xb];
    pdVar3[0xac] = pdVar3[0xc];
    pdVar3[0xad] = pdVar3[0xd];
    pdVar3[0xae] = pdVar3[0xe];
    pdVar3[0xaf] = pdVar3[0xf];
    pdVar3[0xb2] = pdVar3[0x12];
    pdVar3[0xb3] = pdVar3[0x13];
    pdVar3[0xb0] = pdVar3[0x10];
    pdVar3[0xb1] = pdVar3[0x11];
    iVar13 = 2;
  }
  return iVar13;
}

Assistant:

int ON_Sphere::GetNurbForm( ON_NurbsSurface& s ) const
{
  int rc = 0;
  if ( IsValid() ) {
    s.Create(3,true,3,3,9,5);
    s.m_knot[0][0] = s.m_knot[0][1] = 0.0;
    s.m_knot[0][2] = s.m_knot[0][3] = 0.5*ON_PI;
    s.m_knot[0][4] = s.m_knot[0][5] = ON_PI;
    s.m_knot[0][6] = s.m_knot[0][7] = 1.5*ON_PI;
    s.m_knot[0][8] = s.m_knot[0][9] = 2.0*ON_PI;

    s.m_knot[1][0] = s.m_knot[1][1] = -0.5*ON_PI;
    s.m_knot[1][2] = s.m_knot[1][3] = 0.0;
    s.m_knot[1][4] = s.m_knot[1][5] = 0.5*ON_PI;

    ON_4dPoint* CV = (ON_4dPoint*)s.m_cv;
    const ON_3dVector x = radius*plane.xaxis;
    const ON_3dVector y = radius*plane.yaxis;
    const ON_3dVector z = radius*plane.zaxis;

    ON_3dPoint p[9] = {plane.origin+x,
                       plane.origin+x+y,
                       plane.origin+y,
                       plane.origin-x+y,
                       plane.origin-x,
                       plane.origin-x-y,
                       plane.origin-y,
                       plane.origin+x-y,
                       plane.origin+x};

    const double w = 1.0/sqrt(2.0);
    double w13;
    int i;
    ON_4dPoint southpole = plane.origin - z;
    ON_4dPoint northpole = plane.origin + z;
    for ( i = 0; i < 8; i++ ) {
      CV[5*i  ] = southpole;
      CV[5*i+1] = p[i] - z;
      CV[5*i+2] = p[i];
      CV[5*i+3] = p[i] + z;
      CV[5*i+4] = northpole;

      if ( i%2) {
        CV[5*i  ].x *= w;
        CV[5*i  ].y *= w;
        CV[5*i  ].z *= w;
        CV[5*i  ].w = w;
        CV[5*i+2].x *= w;
        CV[5*i+2].y *= w;
        CV[5*i+2].z *= w;
        CV[5*i+2].w = w;
        CV[5*i+4].x *= w;
        CV[5*i+4].y *= w;
        CV[5*i+4].z *= w;
        CV[5*i+4].w = w;
        w13 = 0.5;
      }
      else {
        w13 = w;
      }
      CV[5*i+1].x *= w13;
      CV[5*i+1].y *= w13;
      CV[5*i+1].z *= w13;
      CV[5*i+1].w  = w13;

      CV[5*i+3].x *= w13;
      CV[5*i+3].y *= w13;
      CV[5*i+3].z *= w13;
      CV[5*i+3].w  = w13;
    }
    CV[40] = CV[0];
    CV[41] = CV[1];
    CV[42] = CV[2];
    CV[43] = CV[3];
    CV[44] = CV[4];
    rc = 2;
  }
  return rc;
}